

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.cpp
# Opt level: O1

void __thiscall
helics::FilterInfo::addSourceEndpoint
          (FilterInfo *this,GlobalHandle dest,string_view sourceName,string_view sourceType)

{
  pointer pEVar1;
  pointer pGVar2;
  pointer pEVar3;
  EptInformation *ti;
  pointer pEVar4;
  bool bVar5;
  GlobalHandle local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_38._M_str = sourceType._M_str;
  local_38._M_len = sourceType._M_len;
  local_28._M_str = sourceName._M_str;
  local_28._M_len = sourceName._M_len;
  pEVar4 = (this->sourceEndpoints).
           super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->sourceEndpoints).
           super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pEVar4 == pEVar1;
  if (!bVar5) {
    if (((pEVar4->id).fed_id.gid != dest.fed_id.gid.gid) ||
       ((pEVar4->id).handle.hid != dest.handle.hid.hid)) {
      pEVar4 = pEVar4 + 1;
      do {
        pEVar3 = pEVar4;
        bVar5 = pEVar3 == pEVar1;
        if (bVar5) goto LAB_0033658c;
        pEVar4 = pEVar3 + 1;
      } while (((pEVar3->id).fed_id.gid != dest.fed_id.gid.gid) ||
              ((pEVar3->id).handle.hid != dest.handle.hid.hid));
    }
    if (!bVar5) {
      return;
    }
  }
LAB_0033658c:
  local_40 = dest;
  std::vector<helics::EptInformation,std::allocator<helics::EptInformation>>::
  emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<helics::EptInformation,std::allocator<helics::EptInformation>> *)
             &this->sourceEndpoints,&local_40,&local_28,&local_38);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::reserve
            (&this->sourceTargets,
             ((long)(this->sourceEndpoints).
                    super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->sourceEndpoints).
                    super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pGVar2 = (this->sourceTargets).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->sourceTargets).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar2) {
    (this->sourceTargets).
    super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar2;
  }
  (this->sourceEpts)._M_string_length = 0;
  *(this->sourceEpts)._M_dataplus._M_p = '\0';
  pEVar1 = (this->sourceEndpoints).
           super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar4 = (this->sourceEndpoints).
                super__Vector_base<helics::EptInformation,_std::allocator<helics::EptInformation>_>.
                _M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
    emplace_back<helics::GlobalHandle_const&>
              ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
               &this->sourceTargets,&pEVar4->id);
  }
  return;
}

Assistant:

void FilterInfo::addSourceEndpoint(GlobalHandle dest,
                                   std::string_view sourceName,
                                   std::string_view sourceType)
{
    for (const auto& si : sourceEndpoints) {
        if (si.id == dest) {
            return;
        }
    }
    sourceEndpoints.emplace_back(dest, sourceName, sourceType);
    /** now update the target information*/
    sourceTargets.reserve(sourceEndpoints.size());
    sourceTargets.clear();
    sourceEpts.clear();
    for (const auto& ti : sourceEndpoints) {
        sourceTargets.emplace_back(ti.id);
    }
}